

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O1

void __thiscall
flatbuffers::FlatCompiler::ParseFile
          (FlatCompiler *this,Parser *parser,string *filename,string *contents,
          vector<const_char_*,_std::allocator<const_char_*>_> *include_directories)

{
  bool bVar1;
  vector<const_char_*,_std::allocator<const_char_*>_> inc_directories;
  string local_include_directory;
  char **local_68;
  undefined8 uStack_60;
  long local_58;
  char *local_50;
  string local_48;
  
  StripFileName(&local_48,filename);
  local_68 = (char **)0x0;
  uStack_60 = 0;
  local_58 = 0;
  std::vector<char_const*,std::allocator<char_const*>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<char_const*const*,std::vector<char_const*,std::allocator<char_const*>>>>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_68,0,
             (include_directories->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
             _M_impl.super__Vector_impl_data._M_start,
             (include_directories->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
             _M_impl.super__Vector_impl_data._M_finish);
  local_50 = local_48._M_dataplus._M_p;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_68,&local_50);
  local_50 = (char *)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_68,&local_50);
  bVar1 = Parser::Parse(parser,(contents->_M_dataplus)._M_p,local_68,(filename->_M_dataplus)._M_p);
  if (!bVar1) {
    (*(this->params_).error_fn)(this,&parser->error_,false,false);
  }
  if ((parser->error_)._M_string_length != 0) {
    (*(this->params_).warn_fn)(this,&parser->error_,false);
  }
  if (local_68 != (char **)0x0) {
    operator_delete(local_68,local_58 - (long)local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FlatCompiler::ParseFile(
    flatbuffers::Parser &parser, const std::string &filename,
    const std::string &contents,
    const std::vector<const char *> &include_directories) const {
  auto local_include_directory = flatbuffers::StripFileName(filename);

  std::vector<const char *> inc_directories;
  inc_directories.insert(inc_directories.end(), include_directories.begin(),
                         include_directories.end());
  inc_directories.push_back(local_include_directory.c_str());
  inc_directories.push_back(nullptr);

  if (!parser.Parse(contents.c_str(), &inc_directories[0], filename.c_str())) {
    Error(parser.error_, false, false);
  }
  if (!parser.error_.empty()) { Warn(parser.error_, false); }
}